

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error-formatter.cc
# Opt level: O0

void wabt::FormatErrorsToFile
               (Errors *errors,Type location_type,LexerSourceLineFinder *line_finder,FILE *file,
               string *header,PrintHeader print_header,int source_line_max_length)

{
  Color *this;
  void *__ptr;
  size_t __n;
  undefined1 local_68 [8];
  string s;
  Color color;
  PrintHeader print_header_local;
  string *header_local;
  FILE *file_local;
  LexerSourceLineFinder *line_finder_local;
  Type location_type_local;
  Errors *errors_local;
  
  this = (Color *)((long)&s.field_2 + 8);
  Color::Color(this,file,true);
  FormatErrorsToString
            ((string *)local_68,errors,location_type,line_finder,this,header,print_header,
             source_line_max_length);
  __ptr = (void *)std::__cxx11::string::data((string *)local_68);
  __n = std::__cxx11::string::size((string *)local_68);
  fwrite(__ptr,1,__n,(FILE *)file);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void FormatErrorsToFile(const Errors& errors,
                        Location::Type location_type,
                        LexerSourceLineFinder* line_finder,
                        FILE* file,
                        const std::string& header,
                        PrintHeader print_header,
                        int source_line_max_length) {
  Color color(file);
  std::string s =
      FormatErrorsToString(errors, location_type, line_finder, color, header,
                           print_header, source_line_max_length);
  fwrite(s.data(), 1, s.size(), file);
}